

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::LoadConfig(cmCTestLaunch *this)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_18a1;
  string local_18a0;
  cmAlphaNum local_1880;
  cmAlphaNum local_1850;
  undefined1 local_1820 [8];
  string fname;
  undefined1 local_17e8 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8a9;
  string local_8a8;
  undefined1 local_888 [8];
  cmake cm;
  cmCTestLaunch *this_local;
  
  cm.ProfilingOutput._M_t.
  super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>._M_t
  .super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>.
  super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>,_true,_true>
        )(__uniq_ptr_data<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>,_true,_true>
          )this;
  cmake::cmake((cmake *)local_888,RoleScript,CTest,Normal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a8,"",&local_8a9);
  cmake::SetHomeDirectory((cmake *)local_888,&local_8a8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"",&local_8e1);
  cmake::SetHomeOutputDirectory((cmake *)local_888,&local_8e0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator(&local_8e1);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_888);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_888);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)((long)&fname.field_2 + 8),(cmake *)local_888);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_17e8,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,
             (cmStateSnapshot *)((long)&fname.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_1850,&(this->Reporter).LogDir);
  cmAlphaNum::cmAlphaNum(&local_1880,"CTestLaunchConfig.cmake");
  cmStrCat<>((string *)local_1820,&local_1850,&local_1880);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_1820);
  if ((bVar1) &&
     (bVar1 = cmMakefile::ReadListFile((cmMakefile *)local_17e8,(string *)local_1820), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_18a0,"CTEST_SOURCE_DIRECTORY",&local_18a1);
    psVar2 = cmMakefile::GetSafeDefinition((cmMakefile *)local_17e8,&local_18a0);
    std::__cxx11::string::operator=((string *)&(this->Reporter).SourceDir,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_18a0);
    std::allocator<char>::~allocator(&local_18a1);
    cmsys::SystemTools::ConvertToUnixSlashes(&(this->Reporter).SourceDir);
  }
  std::__cxx11::string::~string((string *)local_1820);
  cmMakefile::~cmMakefile((cmMakefile *)local_17e8);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_888);
  return;
}

Assistant:

void cmCTestLaunch::LoadConfig()
{
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  std::string fname =
    cmStrCat(this->Reporter.LogDir, "CTestLaunchConfig.cmake");
  if (cmSystemTools::FileExists(fname) && mf.ReadListFile(fname)) {
    this->Reporter.SourceDir = mf.GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
    cmSystemTools::ConvertToUnixSlashes(this->Reporter.SourceDir);
  }
}